

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_util.cc
# Opt level: O0

bool bloaty::dwarf::IsValidDwarfAddress(uint64_t addr,uint8_t address_size)

{
  uint uVar1;
  unsigned_long uVar2;
  char in_SIL;
  unsigned_long in_RDI;
  bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    if ((in_SIL == '\x04') && (uVar1 = std::numeric_limits<unsigned_int>::max(), in_RDI == uVar1)) {
      return false;
    }
    if ((in_SIL == '\b') && (uVar2 = std::numeric_limits<unsigned_long>::max(), in_RDI == uVar2)) {
      return false;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool IsValidDwarfAddress(uint64_t addr, uint8_t address_size) {
  if (addr == 0)
    return false;
  if (address_size == 4 && addr == std::numeric_limits<uint32_t>::max())
    return false;
  if (address_size == 8 && addr == std::numeric_limits<uint64_t>::max())
    return false;
  return true;
}